

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack24_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0xffffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x18;
  out[1] = (uVar1 >> 0x18) + base + (in[1] & 0xffff) * 0x100;
  uVar1 = in[1];
  out[2] = uVar1 >> 0x10;
  out[2] = (uVar1 >> 0x10) + base + (in[2] & 0xff) * 0x10000;
  out[3] = (in[2] >> 8) + base;
  out[4] = (in[3] & 0xffffff) + base;
  uVar1 = in[3];
  out[5] = uVar1 >> 0x18;
  out[5] = (uVar1 >> 0x18) + base + (in[4] & 0xffff) * 0x100;
  uVar1 = in[4];
  out[6] = uVar1 >> 0x10;
  out[6] = (uVar1 >> 0x10) + base + (in[5] & 0xff) * 0x10000;
  out[7] = (in[5] >> 8) + base;
  return in + 6;
}

Assistant:

uint32_t * unpack24_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 24 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 24 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 24 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 24 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 24 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 24 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}